

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decide.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
Jam_Turn(int dep,GameBoard *gameBoard,int pl_col,vector<double,_std::allocator<double>_> *A_i)

{
  int *piVar1;
  long lVar2;
  int in_ECX;
  long in_RDX;
  vector<int,_std::allocator<int>_> *in_RDI;
  value_type_conflict2 *in_R8;
  vector<int,_std::allocator<int>_> *this;
  int i_1;
  int i;
  int min_type;
  vector<int,_std::allocator<int>_> *index;
  int *in_stack_0001d298;
  int *in_stack_0001d2a0;
  int in_stack_0001d2a8;
  int in_stack_0001d2ac;
  GameBoard *in_stack_0001d2b0;
  int in_stack_0001d2bc;
  int *in_stack_0001d2d0;
  int *in_stack_0001d2d8;
  int *this_00;
  value_type_conflict2 *__x;
  int local_48;
  int local_34;
  int local_2c;
  value_type_conflict2 *local_28;
  int local_1c;
  long local_18;
  
  local_2c = 100000;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1445d0);
  for (local_34 = 0; local_34 < 7; local_34 = local_34 + 1) {
    piVar1 = std::min<int>((int *)(local_18 + (long)local_1c * 0x1c + 0x9ec + (long)local_34 * 4),
                           &local_2c);
    local_2c = *piVar1;
  }
  for (local_48 = 0; local_48 < 7; local_48 = local_48 + 1) {
    if (*(int *)(local_18 + 0x9ec + (long)local_1c * 0x1c + (long)local_48 * 4) <= local_2c + 1) {
      lVar2 = local_18 + (long)local_1c * 0x1c;
      *(int *)(lVar2 + 0x9ec + (long)local_48 * 4) =
           *(int *)(lVar2 + 0x9ec + (long)local_48 * 4) + 1;
      this_00 = &nouse;
      piVar1 = &nouse;
      __x = local_28;
      this = (vector<int,_std::allocator<int>_> *)
             Place_Turn(in_stack_0001d2bc,in_stack_0001d2b0,in_stack_0001d2ac,in_stack_0001d2a8,
                        in_stack_0001d2a0,in_stack_0001d298,in_stack_0001d2d0,in_stack_0001d2d8);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)this_00,(value_type_conflict1 *)piVar1);
      std::vector<int,_std::allocator<int>_>::push_back(this,__x);
      lVar2 = local_18 + 0x9ec + (long)local_1c * 0x1c;
      *(int *)(lVar2 + (long)local_48 * 4) = *(int *)(lVar2 + (long)local_48 * 4) + -1;
    }
  }
  return in_RDI;
}

Assistant:

vector<int> Jam_Turn(int dep, GameBoard &gameBoard, int pl_col, vector<double> &A_i) //返回可行方案编号
{
    int  min_type = 1e5;
    vector<int> index;
    for (int i = 0; i < 7; i++)
        min_type = std::min(gameBoard.typeCountForColor[pl_col][i], min_type);
    for (int i = 0; i < 7; i++)
        if (gameBoard.typeCountForColor[pl_col][i] <= min_type + 1)
        {
            gameBoard.typeCountForColor[pl_col][i] ++;
            A_i.push_back(Place_Turn(dep + 1, gameBoard, pl_col, i));
            index.push_back(i);
            gameBoard.typeCountForColor[pl_col][i] --;
        }
    return index;
}